

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perseus.cpp
# Opt level: O0

void __thiscall Perseus::BackupStageLeadOut(Perseus *this,GaoVectorSet *Gao)

{
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar1;
  sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
  *this_00;
  sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
  *psVar2;
  ulong idx;
  size_t sVar3;
  reference ppmVar4;
  TimedAlgorithm *this_01;
  long *in_RDI;
  uint o;
  uint a;
  Perseus *in_stack_ffffffffffffff28;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  *in_stack_ffffffffffffff78;
  string local_68 [80];
  uint local_18;
  uint local_14;
  
  local_14 = 0;
  while( true ) {
    this_00 = (sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
               *)(ulong)local_14;
    AlphaVectorPlanning::GetPU((AlphaVectorPlanning *)in_stack_ffffffffffffff28);
    psVar2 = (sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
              *)PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x921229);
    if (this_00 == psVar2) break;
    local_18 = 0;
    while( true ) {
      idx = (ulong)local_18;
      AlphaVectorPlanning::GetPU((AlphaVectorPlanning *)in_stack_ffffffffffffff28);
      sVar3 = PlanningUnitMADPDiscrete::GetNrJointObservations((PlanningUnitMADPDiscrete *)0x92126a)
      ;
      if (idx == sVar3) break;
      boost::
      multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
      ::operator[](in_stack_ffffffffffffff78,(index)in_RDI);
      ppmVar4 = boost::detail::multi_array::
                sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
                ::operator[](this_00,idx);
      pmVar1 = *ppmVar4;
      if (pmVar1 != (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                     *)0x0) {
        boost::numeric::ublas::
        matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::~matrix(in_stack_ffffffffffffff30);
        operator_delete(pmVar1,0x28);
      }
      boost::detail::multi_array::
      sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
      ::~sub_array((sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
                    *)0x9212ee);
      local_18 = local_18 + 1;
    }
    local_14 = local_14 + 1;
  }
  this_01 = (TimedAlgorithm *)((long)in_RDI + *(long *)(*in_RDI + -0x18));
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffff78;
  GetIdentification_abi_cxx11_(in_stack_ffffffffffffff28);
  std::operator+(__lhs,(char *)this_01);
  TimedAlgorithm::StopTimer(this_01,(string *)in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  return;
}

Assistant:

void Perseus::BackupStageLeadOut(GaoVectorSet Gao) const
{
    // release the memory of the back-projected vectors
    for(unsigned int a=0;a!=GetPU()->GetNrJointActions();a++)
        for(unsigned int o=0;o!=GetPU()->GetNrJointObservations();o++)
            delete(Gao[a][o]);
    
    StopTimer(GetIdentification() + "BackupStage");
}